

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::reduceu
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  int in_ESI;
  PtexHalf *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  int in_stack_00000020;
  
  switch(in_stack_00000008) {
  case 0:
    anon_unknown_1::reduceu<unsigned_char>
              ((uchar *)CONCAT44(dstride,in_stack_00000010),in_stack_0000000c,in_stack_00000008,
               unaff_retaddr,(uchar *)in_RDI,in_ESI,in_stack_00000020);
    break;
  case 1:
    anon_unknown_1::reduceu<unsigned_short>
              ((unsigned_short *)CONCAT44(dstride,in_stack_00000010),in_stack_0000000c,
               in_stack_00000008,unaff_retaddr,&in_RDI->bits,in_ESI,in_stack_00000020);
    break;
  case 2:
    anon_unknown_1::reduceu<Ptex::v2_2::PtexHalf>
              ((PtexHalf *)CONCAT44(dstride,in_stack_00000010),in_stack_0000000c,in_stack_00000008,
               unaff_retaddr,in_RDI,in_ESI,in_stack_00000020);
    break;
  case 3:
    anon_unknown_1::reduceu<float>
              ((float *)CONCAT44(dstride,in_stack_00000010),in_stack_0000000c,in_stack_00000008,
               unaff_retaddr,(float *)in_RDI,in_ESI,in_stack_00000020);
  }
  return;
}

Assistant:

void reduceu(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceu(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceu(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceu(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceu(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}